

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_remove(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  
  if (idx < 1) {
    pTVar1 = L->top + idx;
  }
  else {
    pTVar1 = L->base + ((ulong)(uint)idx - 1);
    if (L->top <= L->base + ((ulong)(uint)idx - 1)) {
      pTVar1 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
    }
  }
  while( true ) {
    pTVar2 = pTVar1 + 1;
    if (L->top <= pTVar2) break;
    *pTVar1 = *pTVar2;
    pTVar1 = pTVar2;
  }
  L->top = L->top + -1;
  return;
}

Assistant:

static TValue *stkindex2adr(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    return o < L->top ? o : niltv(L);
  } else {
    api_check(L, idx != 0 && -idx <= L->top - L->base);
    return L->top + idx;
  }
}